

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void INT_EVsubmit(EVsource source,void *data,attr_list attrs)

{
  int iVar1;
  event_item *peVar2;
  undefined8 uVar3;
  FMFormat p_Var4;
  attr_list p_Var5;
  undefined8 in_RDX;
  CManager_conflict in_RSI;
  long *in_RDI;
  event_item *event;
  event_path_data evp;
  int in_stack_0000002c;
  event_item *in_stack_00000030;
  CManager_conflict in_stack_00000038;
  CManager_conflict in_stack_000000c0;
  event_path_data evp_00;
  
  iVar1 = (int)((ulong)in_RDX >> 0x20);
  evp_00 = *(event_path_data *)(*in_RDI + 0x118);
  if ((int)in_RDI[3] != -1) {
    peVar2 = get_free_event(evp_00);
    if (in_RDI[4] == 0) {
      peVar2->contents = Event_App_Owned;
    }
    else {
      peVar2->contents = Event_Freeable;
    }
    peVar2->cm = (CManager_conflict)*in_RDI;
    if (*(int *)((long)in_RDI + 0x1c) == 0) {
      peVar2->event_encoded = 0;
      peVar2->decoded_event = in_RSI;
      peVar2->reference_format = (FMFormat)in_RDI[2];
      peVar2->format = (CMFormat)in_RDI[1];
    }
    else {
      peVar2->event_encoded = 1;
      peVar2->encoded_event = in_RSI;
      uVar3 = FFSTypeHandle_from_encode(evp_00->ffsc,in_RSI);
      p_Var4 = (FMFormat)FMFormat_of_original(uVar3);
      peVar2->reference_format = p_Var4;
    }
    peVar2->free_func = (EVFreeFunction)in_RDI[4];
    peVar2->free_arg = (void *)in_RDI[5];
    p_Var5 = CMint_add_ref_attr_list
                       ((CManager)evp,(attr_list)event,(char *)in_RDI,(int)((ulong)in_RSI >> 0x20));
    peVar2->attrs = p_Var5;
    internal_path_submit(in_RSI,iVar1,(event_item *)evp_00);
    do {
      iVar1 = process_local_actions(in_stack_000000c0);
    } while (iVar1 != 0);
    if ((peVar2->ref_count != 1) && (peVar2->contents == Event_App_Owned)) {
      reassign_memory_event(in_stack_00000038,in_stack_00000030,in_stack_0000002c);
    }
    return_event((event_path_data)source,(event_item *)data);
  }
  return;
}

Assistant:

void
INT_EVsubmit(EVsource source, void *data, attr_list attrs)
{
    event_path_data evp = source->cm->evp;
    event_item *event;
    if (source->local_stone_id == -1) return;  /* not connected */
    event = get_free_event(evp);
    if (source->free_func != NULL) {
	event->contents = Event_Freeable;
    } else {
	event->contents = Event_App_Owned;
    }
    event->cm = source->cm;
    if (source->preencoded) {
	event->event_encoded = 1;
	event->encoded_event = data;
	event->reference_format = FMFormat_of_original(FFSTypeHandle_from_encode(evp->ffsc, 
							    data));
    } else {
	event->event_encoded = 0;
	event->decoded_event = data;
	event->reference_format = source->reference_format;
	event->format = source->format;
    }
    event->free_func = source->free_func;
    event->free_arg = source->free_data;
    event->attrs = CMadd_ref_attr_list(source->cm, attrs);
    internal_path_submit(source->cm, source->local_stone_id, event);
    while (process_local_actions(source->cm));
    if (event->ref_count != 1 && (event->contents == Event_App_Owned)) {
	event = reassign_memory_event(source->cm, event, 1);  /* reassign memory */
    }
    return_event(source->cm->evp, event);
}